

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.h
# Opt level: O0

string * Hpipe::to_string<char>(string *__return_storage_ptr__,char *val)

{
  ostringstream local_190 [8];
  ostringstream ss;
  char *val_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,*val);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( const T &val ) {
    std::ostringstream ss;
    ss << val;
    return ss.str();
}